

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

int lyd_defaults_add_unres
              (lyd_node **root,int options,ly_ctx *ctx,lys_module **modules,int mod_count,
              lyd_node *data_tree,lyd_node *act_notif,unres_data *unres,int wd)

{
  LYS_NODE LVar1;
  lys_module *plVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ly_set *set;
  char *format;
  lys_node **pplVar6;
  lys_node *plVar7;
  lyd_node *plVar8;
  lyd_node *plVar9;
  lyd_node **root_00;
  ly_ctx *ctx_00;
  lyd_node *parent;
  ulong uVar10;
  long lVar11;
  lyd_node *node1;
  bool bVar12;
  lyd_node *plStackY_70;
  lys_node *local_58;
  lyd_node *local_40;
  uint local_34;
  
  if (root == (lyd_node **)0x0) {
LAB_00168302:
    __assert_fail("root && (*root || ctx) && unres && !(options & LYD_OPT_ACT_NOTIF)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                  ,0x1dd8,
                  "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lys_module **, int, const struct lyd_node *, struct lyd_node *, struct unres_data *, int)"
                 );
  }
  plVar9 = *root;
  if (((((uint)options >> 8 & 1) != 0) || (unres == (unres_data *)0x0)) ||
     (ctx == (ly_ctx *)0x0 && plVar9 == (lyd_node *)0x0)) goto LAB_00168302;
  if (ctx == (ly_ctx *)0x0) {
    ctx = plVar9->schema->module->ctx;
  }
  plStackY_70 = (lyd_node *)0x1;
  if (plVar9 == (lyd_node *)0x0 && ((uint)options >> 0xc & 1) != 0) {
    format = "Cannot add default values for one module (LYD_OPT_NOSIBLINGS) without any data.";
  }
  else {
    if ((options & 0x70U) == 0) {
      local_34 = options;
      if ((plVar9 != (lyd_node *)0x0) && (local_34 = options, plVar9->parent != (lyd_node *)0x0)) {
        local_34 = options | 0x1000;
      }
      local_58 = (lys_node *)0x0;
LAB_00167d13:
      if (wd != 0) {
        root_00 = &act_notif;
        if (act_notif == (lyd_node *)0x0) {
          root_00 = root;
        }
        if ((local_34 >> 8 & 1) != 0) {
          __assert_fail("root && !(options & LYD_OPT_ACT_NOTIF)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                        ,0x1d7c,
                        "int lyd_wd_add(struct lyd_node **, struct ly_ctx *, const struct lys_module **, int, struct unres_data *, int)"
                       );
        }
        plVar9 = *root_00;
        if (ctx == (ly_ctx *)0x0 && plVar9 == (lyd_node *)0x0) {
          __assert_fail("*root || ctx",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                        ,0x1d7d,
                        "int lyd_wd_add(struct lyd_node **, struct ly_ctx *, const struct lys_module **, int, struct unres_data *, int)"
                       );
        }
        if ((local_34 >> 0xc & 1) != 0 && plVar9 == (lyd_node *)0x0) {
          __assert_fail("!(options & LYD_OPT_NOSIBLINGS) || *root",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                        ,0x1d7e,
                        "int lyd_wd_add(struct lyd_node **, struct ly_ctx *, const struct lys_module **, int, struct unres_data *, int)"
                       );
        }
        if ((local_34 & 0xe) == 0) {
          ctx_00 = ctx;
          if (ctx == (ly_ctx *)0x0) {
            ctx_00 = plVar9->schema->module->ctx;
          }
          iVar3 = 1;
          if ((local_34 & 0x10000f1) != 0 && (local_34 & 1) == 0) {
            if ((local_34 & 0x40) == 0) {
              if ((local_34 & 0x30) == 0) {
                if ((local_34 >> 0x18 & 1) == 0) {
                  ly_log(ctx_00,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                         ,0x1dc7);
                  goto LAB_00167c34;
                }
                goto LAB_0016820a;
              }
              if ((plVar9 != (lyd_node *)0x0) &&
                 ((plVar9->schema->nodetype & (LYS_ACTION|LYS_RPC)) != LYS_UNKNOWN)) {
                pplVar6 = &plVar9->schema->child;
                if ((local_34 & 0x10) == 0) {
                  while (plVar7 = *pplVar6, plVar7 != (lys_node *)0x0) {
                    if (plVar7->nodetype == LYS_OUTPUT) goto LAB_001682bf;
                    pplVar6 = &plVar7->next;
                  }
                }
                else {
                  while (plVar7 = *pplVar6, plVar7 != (lys_node *)0x0) {
                    if (plVar7->nodetype == LYS_INPUT) goto LAB_001682bf;
                    pplVar6 = &plVar7->next;
                  }
                }
                goto LAB_00167d5e;
              }
              format = "Subtree is not a single RPC/action/reply.";
              ctx = ctx_00;
            }
            else {
              if ((plVar9 != (lyd_node *)0x0) &&
                 (plVar7 = plVar9->schema, plVar7->nodetype == LYS_NOTIF)) {
                iVar3 = 0;
                goto LAB_00168218;
              }
              format = "Subtree is not a single notification.";
              ctx = ctx_00;
            }
            goto LAB_00167c2b;
          }
          if ((local_34 >> 0xc & 1) == 0) {
            if (mod_count == 0 || modules == (lys_module **)0x0) {
              for (lVar11 = 0; lVar11 < (ctx_00->models).used; lVar11 = lVar11 + 1) {
                plVar2 = (ctx_00->models).list[lVar11];
                if ((*(ushort *)&plVar2->field_0x40 & 0xc0) == 0x80) {
                  pplVar6 = &plVar2->data;
                  while (plVar7 = *pplVar6, plVar7 != (lys_node *)0x0) {
                    if (((plVar7->nodetype & 0x903f) != LYS_UNKNOWN) &&
                       (iVar3 = lyd_wd_add_subtree(root_00,(lyd_node *)0x0,(lyd_node *)0x0,plVar7,1,
                                                   local_34,unres), iVar3 != 0)) goto LAB_00167c34;
                    pplVar6 = &plVar7->next;
                  }
                }
              }
            }
            else {
              uVar5 = 0;
              uVar10 = (ulong)(uint)mod_count;
              if (mod_count < 1) {
                uVar10 = uVar5;
              }
              for (; local_40 = (lyd_node *)modules, uVar5 != uVar10; uVar5 = uVar5 + 1) {
                pplVar6 = &modules[uVar5]->data;
                while (plVar7 = *pplVar6, plVar7 != (lys_node *)0x0) {
                  if (((plVar7->nodetype & 0x903f) != LYS_UNKNOWN) &&
                     (iVar3 = lyd_wd_add_subtree(root_00,(lyd_node *)0x0,(lyd_node *)0x0,plVar7,1,
                                                 local_34,unres), iVar3 != 0)) goto LAB_00167c34;
                  pplVar6 = &plVar7->next;
                }
              }
            }
          }
          else {
LAB_0016820a:
            plVar7 = plVar9->schema;
            plVar9 = (lyd_node *)0x0;
LAB_00168218:
            iVar3 = lyd_wd_add_subtree(root_00,plVar9,plVar9,plVar7,iVar3,local_34,unres);
            if (iVar3 != 0) goto LAB_00167c34;
          }
        }
      }
LAB_00167d5e:
      if (unres->count == 0) {
LAB_00168119:
        plStackY_70 = (lyd_node *)0x0;
        goto LAB_00167c34;
      }
      plVar9 = *root;
      if (plVar9 == (lyd_node *)0x0) {
        ly_log(ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
               ,0x1e06);
        goto LAB_00167e56;
      }
      bVar12 = (local_34 & 0x70) != 0;
      if (bVar12 && data_tree != (lyd_node *)0x0) {
        local_40 = data_tree;
        if (act_notif != (lyd_node *)0x0) {
          plVar8 = plVar9;
          plStackY_70 = (lyd_node *)0x0;
          parent = (lyd_node *)0x0;
LAB_00167e88:
          while (plVar9 = plVar8, node1 = local_40, node1 != (lyd_node *)0x0) {
            while( true ) {
              if (node1 == (lyd_node *)0x0) goto LAB_00167ebc;
              if ((node1->schema == plVar9->schema) &&
                 ((plVar9->schema->nodetype != LYS_LIST ||
                  (iVar3 = lyd_list_equal(node1,plVar9,0), iVar3 != 0)))) break;
              node1 = node1->next;
            }
            plVar8 = plVar9->child;
            if (plVar8 == (lyd_node *)0x0) {
              __assert_fail("msg_sibling->child",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                            ,0x1e27,
                            "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lys_module **, int, const struct lyd_node *, struct lyd_node *, struct unres_data *, int)"
                           );
            }
            local_40 = node1->child;
            while (LVar1 = plVar8->schema->nodetype, LVar1 == LYS_LEAF) {
              plVar8 = plVar8->next;
              if (plVar8 == (lyd_node *)0x0) {
                __assert_fail("msg_sibling->next",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                              ,0x1e2b,
                              "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lys_module **, int, const struct lyd_node *, struct lyd_node *, struct unres_data *, int)"
                             );
              }
            }
            plStackY_70 = node1;
            parent = plVar9;
            if ((LVar1 & (LYS_ACTION|LYS_NOTIF)) != LYS_UNKNOWN) {
              if (act_notif->parent == (lyd_node *)0x0) {
                __assert_fail("act_notif->parent",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                              ,0x1e2f,
                              "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lys_module **, int, const struct lyd_node *, struct lyd_node *, struct unres_data *, int)"
                             );
              }
              if (act_notif->parent->schema != node1->schema) {
                __assert_fail("act_notif->parent->schema == data_tree_parent->schema",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                              ,0x1e30,
                              "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lys_module **, int, const struct lyd_node *, struct lyd_node *, struct unres_data *, int)"
                             );
              }
              plVar9 = plVar8;
              if (plVar8 != act_notif) {
                __assert_fail("msg_sibling == act_notif",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                              ,0x1e31,
                              "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lys_module **, int, const struct lyd_node *, struct lyd_node *, struct unres_data *, int)"
                             );
              }
              goto LAB_00168028;
            }
          }
          local_40 = (lyd_node *)0x0;
LAB_00168028:
          if (plStackY_70 == (lyd_node *)0x0) {
            local_40 = data_tree;
          }
          goto LAB_0016803f;
        }
        parent = (lyd_node *)0x0;
        plStackY_70 = (lyd_node *)0x0;
LAB_0016803f:
        lyd_unlink_internal(plVar9,0);
        if (plStackY_70 == (lyd_node *)0x0 && local_40 == (lyd_node *)0x0) {
          __assert_fail("data_tree_parent || data_tree_sibling",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                        ,0x1e46,
                        "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lys_module **, int, const struct lyd_node *, struct lyd_node *, struct unres_data *, int)"
                       );
        }
        if (plStackY_70 == (lyd_node *)0x0) {
          if (local_40->parent != (lyd_node *)0x0) {
            __assert_fail("!data_tree_sibling->parent",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                          ,0x1e4c,
                          "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lys_module **, int, const struct lyd_node *, struct lyd_node *, struct unres_data *, int)"
                         );
          }
          plStackY_70 = (lyd_node *)0x0;
          iVar3 = lyd_insert_nextto(local_40->prev,plVar9,0,0);
        }
        else {
          iVar3 = lyd_insert_common(plStackY_70,(lyd_node **)0x0,plVar9,0);
        }
        if (iVar3 == 0) goto LAB_0016809d;
        plStackY_70 = (lyd_node *)0x1;
      }
      else {
        plVar9 = (lyd_node *)0x0;
        parent = (lyd_node *)0x0;
LAB_0016809d:
        iVar3 = resolve_unres_data(ctx,unres,root,local_34);
        if (iVar3 == 0) {
          if ((local_34 & 0x70) == 0) goto LAB_00168119;
          if (data_tree == (lyd_node *)0x0) {
            if (*root != (lyd_node *)0x0) {
              set = lyd_find_instance(*root,local_58);
              if ((set == (ly_set *)0x0) || (uVar4 = set->number, 1 < uVar4)) {
                __assert_fail("set && ((set->number == 0) || (set->number == 1))",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                              ,0x1e62,
                              "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lys_module **, int, const struct lyd_node *, struct lyd_node *, struct unres_data *, int)"
                             );
              }
              goto LAB_0016825a;
            }
            set = (ly_set *)0x0;
LAB_00168266:
            ly_vlog(ctx,LYE_SPEC,LY_VLOG_LYS,local_58,
                    "Operation/notification not supported because of the current configuration.");
            plStackY_70 = (lyd_node *)0x1;
          }
          else {
            if (plStackY_70 != (lyd_node *)0x0) {
              local_40 = plStackY_70;
            }
            set = lyd_find_instance(local_40,local_58);
            if ((set == (ly_set *)0x0) || (uVar4 = set->number, 1 < uVar4)) {
              __assert_fail("set && ((set->number == 0) || (set->number == 1))",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                            ,0x1e5f,
                            "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lys_module **, int, const struct lyd_node *, struct lyd_node *, struct unres_data *, int)"
                           );
            }
LAB_0016825a:
            plStackY_70 = (lyd_node *)0x0;
            if (uVar4 == 0) goto LAB_00168266;
          }
          ly_set_free(set);
        }
        else {
          plStackY_70 = (lyd_node *)0x1;
        }
      }
      if ((bVar12 && data_tree != (lyd_node *)0x0) &&
         (lyd_unlink_internal(plVar9,0), parent != (lyd_node *)0x0)) {
        lyd_insert_common(parent,(lyd_node **)0x0,plVar9,0);
      }
      goto LAB_00167c34;
    }
    if (plVar9 == (lyd_node *)0x0) {
      format = 
      "Cannot add default values to RPC, RPC reply, and notification without at least the empty container."
      ;
    }
    else if ((act_notif == (lyd_node *)0x0 && (options & 0x10U) != 0) &&
            (plVar9->schema->nodetype != LYS_RPC)) {
      format = "Not valid RPC/action data.";
    }
    else {
      if (((options & 0x20U) == 0 || act_notif != (lyd_node *)0x0) ||
         (plVar9->schema->nodetype == LYS_RPC)) {
        if ((options & 0x40U) == 0 || act_notif != (lyd_node *)0x0) {
          plVar8 = act_notif;
          if (act_notif == (lyd_node *)0x0) goto LAB_00167d02;
        }
        else {
          if (plVar9->schema->nodetype != LYS_NOTIF) {
            format = "Not valid notification data.";
            goto LAB_00167c2b;
          }
LAB_00167d02:
          plVar8 = plVar9;
        }
        local_58 = plVar8->schema;
        local_34 = options;
        goto LAB_00167d13;
      }
      format = "Not valid reply data.";
    }
  }
LAB_00167c2b:
  ly_log(ctx,LY_LLERR,LY_EINVAL,format);
LAB_00167c34:
  return (int)plStackY_70;
LAB_001682bf:
  iVar3 = lyd_wd_add_subtree(root_00,plVar9,plVar9,plVar7,0,local_34,unres);
  if (iVar3 == 0) goto LAB_00167d5e;
LAB_00167e56:
  plStackY_70 = (lyd_node *)0x1;
  goto LAB_00167c34;
LAB_00167ebc:
  local_40 = (lyd_node *)0x0;
  plVar8 = plVar9;
  goto LAB_00167e88;
}

Assistant:

int
lyd_defaults_add_unres(struct lyd_node **root, int options, struct ly_ctx *ctx, const struct lys_module **modules,
                       int mod_count, const struct lyd_node *data_tree, struct lyd_node *act_notif,
                       struct unres_data *unres, int wd)
{
    struct lyd_node *msg_sibling = NULL, *msg_parent = NULL, *data_tree_sibling, *data_tree_parent;
    struct lys_node *msg_op = NULL;
    struct ly_set *set;
    int ret = EXIT_FAILURE;

    assert(root && (*root || ctx) && unres && !(options & LYD_OPT_ACT_NOTIF));

    if (!ctx) {
        ctx = (*root)->schema->module->ctx;
    }

    if ((options & LYD_OPT_NOSIBLINGS) && !(*root)) {
        LOGERR(ctx, LY_EINVAL, "Cannot add default values for one module (LYD_OPT_NOSIBLINGS) without any data.");
        return EXIT_FAILURE;
    }

    if (options & (LYD_OPT_RPC | LYD_OPT_RPCREPLY | LYD_OPT_NOTIF)) {
        if (!(*root)) {
            LOGERR(ctx, LY_EINVAL, "Cannot add default values to RPC, RPC reply, and notification without at least the empty container.");
            return EXIT_FAILURE;
        }
        if ((options & LYD_OPT_RPC) && !act_notif && ((*root)->schema->nodetype != LYS_RPC)) {
            LOGERR(ctx, LY_EINVAL, "Not valid RPC/action data.");
            return EXIT_FAILURE;
        }
        if ((options & LYD_OPT_RPCREPLY) && !act_notif && ((*root)->schema->nodetype != LYS_RPC)) {
            LOGERR(ctx, LY_EINVAL, "Not valid reply data.");
            return EXIT_FAILURE;
        }
        if ((options & LYD_OPT_NOTIF) && !act_notif && ((*root)->schema->nodetype != LYS_NOTIF)) {
            LOGERR(ctx, LY_EINVAL, "Not valid notification data.");
            return EXIT_FAILURE;
        }

        /* remember the operation/notification schema */
        msg_op = act_notif ? act_notif->schema : (*root)->schema;
    } else if (*root && (*root)->parent) {
        /* we have inner node, so it will be considered as
         * a root of subtree where to add default nodes and
         * no of its siblings will be affected */
        options |= LYD_OPT_NOSIBLINGS;
    }

    /* add missing default nodes */
    if (wd && lyd_wd_add((act_notif ? &act_notif : root), ctx, modules, mod_count, unres, options)) {
        return EXIT_FAILURE;
    }

    /* check leafrefs and/or instids if any */
    if (unres && unres->count) {
        if (!(*root)) {
            LOGINT(ctx);
            return EXIT_FAILURE;
        }

        /* temporarily link the additional data tree to the RPC/action/notification */
        if (data_tree && (options & (LYD_OPT_RPC | LYD_OPT_RPCREPLY | LYD_OPT_NOTIF))) {
            /* duplicate the message tree - if it gets deleted we would not be able to positively identify it */
            msg_parent = NULL;
            msg_sibling = *root;

            if (act_notif) {
                /* fun case */
                data_tree_parent = NULL;
                data_tree_sibling = (struct lyd_node *)data_tree;
                while (data_tree_sibling) {
                    while (data_tree_sibling) {
                        if ((data_tree_sibling->schema == msg_sibling->schema)
                                && ((msg_sibling->schema->nodetype != LYS_LIST)
                                    || lyd_list_equal(data_tree_sibling, msg_sibling, 0))) {
                            /* match */
                            break;
                        }

                        data_tree_sibling = data_tree_sibling->next;
                    }

                    if (data_tree_sibling) {
                        /* prepare for the new data_tree iteration */
                        data_tree_parent = data_tree_sibling;
                        data_tree_sibling = data_tree_sibling->child;

                        /* find new action sibling to search for later (skip list keys) */
                        msg_parent = msg_sibling;
                        assert(msg_sibling->child);
                        for (msg_sibling = msg_sibling->child;
                                msg_sibling->schema->nodetype == LYS_LEAF;
                                msg_sibling = msg_sibling->next) {
                            assert(msg_sibling->next);
                        }
                        if (msg_sibling->schema->nodetype & (LYS_ACTION | LYS_NOTIF)) {
                            /* we are done */
                            assert(act_notif->parent);
                            assert(act_notif->parent->schema == data_tree_parent->schema);
                            assert(msg_sibling == act_notif);
                            break;
                        }
                    }
                }

                /* loop ended after the first iteration, set the values correctly */
                if (!data_tree_parent) {
                    data_tree_sibling = (struct lyd_node *)data_tree;
                }

            } else {
                /* easy case */
                data_tree_parent = NULL;
                data_tree_sibling = (struct lyd_node *)data_tree;
            }

            /* unlink msg_sibling if needed (won't do anything otherwise) */
            lyd_unlink_internal(msg_sibling, 0);

            /* now we can insert msg_sibling into data_tree_parent or next to data_tree_sibling */
            assert(data_tree_parent || data_tree_sibling);
            if (data_tree_parent) {
                if (lyd_insert_common(data_tree_parent, NULL, msg_sibling, 0)) {
                    goto unlink_datatree;
                }
            } else {
                assert(!data_tree_sibling->parent);
                if (lyd_insert_nextto(data_tree_sibling->prev, msg_sibling, 0, 0)) {
                    goto unlink_datatree;
                }
            }
        }

        if (resolve_unres_data(ctx, unres, root, options)) {
            goto unlink_datatree;
        }

        /* we are done */
        ret = EXIT_SUCCESS;

        /* check that the operation/notification tree was not removed */
        if (options & (LYD_OPT_RPC | LYD_OPT_RPCREPLY | LYD_OPT_NOTIF)) {
            set = NULL;
            if (data_tree) {
                set = lyd_find_instance(data_tree_parent ? data_tree_parent : data_tree_sibling, msg_op);
                assert(set && ((set->number == 0) || (set->number == 1)));
            } else if (*root) {
                set = lyd_find_instance(*root, msg_op);
                assert(set && ((set->number == 0) || (set->number == 1)));
            }
            if (!set || !set->number) {
                /* it was removed, handle specially */
                LOGVAL(ctx, LYE_SPEC, LY_VLOG_LYS, msg_op, "Operation/notification not supported because of the current configuration.");
                ret = EXIT_FAILURE;
            }
            ly_set_free(set);
        }

unlink_datatree:
        /* put the trees back in order */
        if (data_tree && (options & (LYD_OPT_RPC | LYD_OPT_RPCREPLY | LYD_OPT_NOTIF))) {
            /* unlink and insert it back, if there is a parent  */
            lyd_unlink_internal(msg_sibling, 0);
            if (msg_parent) {
                lyd_insert_common(msg_parent, NULL, msg_sibling, 0);
            }
        }
    } else {
        /* we are done */
        ret = EXIT_SUCCESS;
    }

    return ret;
}